

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O1

MPP_RET os_allocator_drm_close(void *ctx)

{
  int iVar1;
  MPP_RET MVar2;
  int *piVar3;
  
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_drm","os_allocator_close doesn\'t accept NULL input\n",(char *)0x0);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)drm_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_drm","dev %d","os_allocator_drm_close",(ulong)*(uint *)((long)ctx + 4));
    }
    iVar1 = close(*(int *)((long)ctx + 4));
    mpp_osal_free("os_allocator_drm_close",ctx);
    MVar2 = MPP_OK;
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      MVar2 = -*piVar3;
    }
  }
  return MVar2;
}

Assistant:

static MPP_RET os_allocator_drm_close(void *ctx)
{
    int ret;
    allocator_ctx_drm *p;

    if (NULL == ctx) {
        mpp_err("os_allocator_close doesn't accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    p = (allocator_ctx_drm *)ctx;
    drm_dbg_func("dev %d", p->drm_device);

    ret = close(p->drm_device);
    mpp_free(p);
    if (ret < 0)
        return (MPP_RET) - errno;

    return MPP_OK;
}